

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_randomness(int N,void *pBuf)

{
  int iVar1;
  sqlite3_vfs *psVar2;
  long lVar3;
  uint uVar4;
  u32 uVar5;
  uint uVar6;
  u32 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  u32 uVar13;
  uint uVar14;
  u32 uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  u32 uVar19;
  uint uVar20;
  uint uVar21;
  u32 uVar22;
  uint uVar23;
  u32 local_94;
  u32 local_90;
  int local_8c;
  u32 local_88;
  uint uStack_84;
  u32 uStack_80;
  uint uStack_7c;
  u32 local_78;
  uint uStack_74;
  u32 uStack_70;
  uint uStack_6c;
  u32 local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  u32 local_48;
  int local_44;
  sqlite3_mutex *local_40;
  void *local_38;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    if (sqlite3Config.bCoreMutex == '\0') {
      local_40 = (sqlite3_mutex *)0x0;
    }
    else {
      local_40 = (*sqlite3Config.mutex.xMutexAlloc)(5);
    }
    if (local_40 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(local_40);
    }
    if (N < 1 || pBuf == (void *)0x0) {
      sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
    }
    else {
      if (sqlite3Prng.s[0] == 0) {
        psVar2 = sqlite3_vfs_find((char *)0x0);
        sqlite3Prng.s[0] = 0x61707865;
        sqlite3Prng.s[1] = 0x3320646e;
        sqlite3Prng.s[2] = 0x79622d32;
        sqlite3Prng.s[3] = 0x6b206574;
        if (psVar2 == (sqlite3_vfs *)0x0) {
          sqlite3Prng.s[0xc] = 0;
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s[4] = 0;
          sqlite3Prng.s[5] = 0;
          sqlite3Prng.s[6] = 0;
          sqlite3Prng.s[7] = 0;
        }
        else if (sqlite3Config.iPrngSeed == 0) {
          (*psVar2->xRandomness)(psVar2,0x2c,(char *)(sqlite3Prng.s + 4));
        }
        else {
          sqlite3Prng.s[6] = 0;
          sqlite3Prng.s[7] = 0;
          sqlite3Prng.s[0xc] = 0;
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s[5] = 0;
          sqlite3Prng.s[4] = sqlite3Config.iPrngSeed;
        }
        sqlite3Prng.s[0xf] = sqlite3Prng.s[0xc];
        sqlite3Prng.s[0xc] = 0;
        sqlite3Prng.n = '\0';
      }
      uVar16 = (uint)sqlite3Prng.n;
      local_8c = N;
      if ((int)(uint)sqlite3Prng.n < N) {
        do {
          if (sqlite3Prng.n != '\0') {
            memcpy(pBuf,sqlite3Prng.out,(ulong)sqlite3Prng.n);
            local_8c = local_8c - (uint)sqlite3Prng.n;
            pBuf = (void *)((long)pBuf + (ulong)(uint)sqlite3Prng.n);
          }
          sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
          local_78 = sqlite3Prng.s[4];
          uStack_74 = sqlite3Prng.s[5];
          local_88 = sqlite3Prng.s[0];
          uStack_84 = sqlite3Prng.s[1];
          local_90 = uStack_84;
          local_68 = sqlite3Prng.s[8];
          uStack_64 = sqlite3Prng.s[9];
          local_94 = uStack_64;
          uStack_70 = sqlite3Prng.s[6];
          uStack_80 = sqlite3Prng.s[2];
          uStack_6c = sqlite3Prng.s[7];
          uStack_7c = sqlite3Prng.s[3];
          uVar19 = sqlite3Prng.s[0xc];
          uVar5 = sqlite3Prng.s[0xd];
          uVar13 = sqlite3Prng.s[0xe];
          uVar15 = sqlite3Prng.s[10];
          uVar22 = sqlite3Prng.s[0xf];
          uVar7 = sqlite3Prng.s[0xb];
          iVar1 = 10;
          do {
            local_44 = iVar1;
            local_48 = uStack_80;
            uVar16 = uVar19 ^ local_88 + local_78;
            uVar17 = uVar16 << 0x10 | uVar16 >> 0x10;
            uVar4 = local_68 + uVar17;
            uVar16 = local_78 ^ uVar4;
            uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
            uVar6 = local_88 + local_78 + uVar16;
            uVar17 = uVar17 ^ uVar6;
            uVar18 = uVar17 << 8 | uVar17 >> 0x18;
            uVar4 = uVar4 + uVar18;
            uVar16 = uVar16 ^ uVar4;
            uVar8 = uVar16 << 7 | uVar16 >> 0x19;
            uVar16 = uVar5 ^ local_90 + uStack_74;
            uVar17 = uVar16 << 0x10 | uVar16 >> 0x10;
            local_94 = local_94 + uVar17;
            uVar16 = uStack_74 ^ local_94;
            uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
            local_90 = local_90 + uStack_74 + uVar16;
            uVar17 = uVar17 ^ local_90;
            uVar17 = uVar17 << 8 | uVar17 >> 0x18;
            local_94 = local_94 + uVar17;
            uVar16 = uVar16 ^ local_94;
            uVar16 = uVar16 << 7 | uVar16 >> 0x19;
            uVar10 = uVar13 ^ local_48 + uStack_70;
            uVar11 = uVar10 << 0x10 | uVar10 >> 0x10;
            uVar14 = uVar15 + uVar11;
            uVar10 = uStack_70 ^ uVar14;
            uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
            uVar9 = local_48 + uStack_70 + uVar10;
            uVar11 = uVar11 ^ uVar9;
            uVar12 = uVar11 << 8 | uVar11 >> 0x18;
            uVar14 = uVar14 + uVar12;
            uVar10 = uVar10 ^ uVar14;
            uVar11 = uVar10 << 7 | uVar10 >> 0x19;
            uVar10 = uVar22 ^ uStack_7c + uStack_6c;
            uVar21 = uVar10 << 0x10 | uVar10 >> 0x10;
            uVar10 = uVar7 + uVar21;
            uVar20 = uStack_6c ^ uVar10;
            uVar20 = uVar20 << 0xc | uVar20 >> 0x14;
            uVar23 = uStack_7c + uStack_6c + uVar20;
            uVar21 = uVar21 ^ uVar23;
            uVar21 = uVar21 << 8 | uVar21 >> 0x18;
            uVar10 = uVar10 + uVar21;
            uVar20 = uVar20 ^ uVar10;
            uVar20 = uVar20 << 7 | uVar20 >> 0x19;
            uVar6 = uVar6 + uVar16;
            uVar21 = uVar21 ^ uVar6;
            uVar21 = uVar21 << 0x10 | uVar21 >> 0x10;
            uVar14 = uVar14 + uVar21;
            uVar16 = uVar16 ^ uVar14;
            uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
            local_88 = uVar6 + uVar16;
            uVar21 = uVar21 ^ local_88;
            uVar22 = uVar21 << 8 | uVar21 >> 0x18;
            uVar15 = uVar14 + uVar22;
            uVar16 = uVar16 ^ uVar15;
            uStack_74 = uVar16 << 7 | uVar16 >> 0x19;
            local_90 = local_90 + uVar11;
            uVar18 = uVar18 ^ local_90;
            uVar6 = uVar18 << 0x10 | uVar18 >> 0x10;
            uVar10 = uVar10 + uVar6;
            uVar11 = uVar11 ^ uVar10;
            uVar16 = uVar11 << 0xc | uVar11 >> 0x14;
            local_90 = local_90 + uVar16;
            uVar6 = uVar6 ^ local_90;
            uVar19 = uVar6 << 8 | uVar6 >> 0x18;
            uVar7 = uVar10 + uVar19;
            uVar16 = uVar16 ^ uVar7;
            uStack_70 = uVar16 << 7 | uVar16 >> 0x19;
            uVar9 = uVar9 + uVar20;
            uVar17 = uVar17 ^ uVar9;
            uVar16 = uVar17 << 0x10 | uVar17 >> 0x10;
            uVar4 = uVar4 + uVar16;
            uVar20 = uVar20 ^ uVar4;
            uVar17 = uVar20 << 0xc | uVar20 >> 0x14;
            uStack_80 = uVar9 + uVar17;
            uVar16 = uVar16 ^ uStack_80;
            uVar5 = uVar16 << 8 | uVar16 >> 0x18;
            local_68 = uVar4 + uVar5;
            uVar17 = uVar17 ^ local_68;
            uStack_6c = uVar17 << 7 | uVar17 >> 0x19;
            uVar23 = uVar23 + uVar8;
            uVar12 = uVar12 ^ uVar23;
            uVar4 = uVar12 << 0x10 | uVar12 >> 0x10;
            local_94 = local_94 + uVar4;
            uVar8 = uVar8 ^ local_94;
            uVar16 = uVar8 << 0xc | uVar8 >> 0x14;
            uStack_7c = uVar23 + uVar16;
            uVar4 = uVar4 ^ uStack_7c;
            uVar13 = uVar4 << 8 | uVar4 >> 0x18;
            local_94 = local_94 + uVar13;
            uVar16 = uVar16 ^ local_94;
            local_78 = uVar16 << 7 | uVar16 >> 0x19;
            iVar1 = local_44 + -1;
          } while (local_44 + -1 != 0);
          _local_88 = CONCAT44(local_90,local_88);
          _local_58 = CONCAT44(uVar5,uVar19);
          _local_68 = CONCAT44(local_94,local_68);
          _uStack_50 = CONCAT44(uVar22,uVar13);
          _uStack_60 = CONCAT44(uVar7,uVar15);
          lVar3 = 0;
          do {
            *(u32 *)(sqlite3Prng.out + lVar3 * 4) = sqlite3Prng.s[lVar3] + (&local_88)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x10);
          sqlite3Prng.n = '@';
          local_38 = pBuf;
        } while (0x40 < local_8c);
        uVar16 = 0x40;
        N = local_8c;
      }
      memcpy(pBuf,sqlite3Prng.out + (int)(uVar16 - N),(long)N);
      sqlite3Prng.n = sqlite3Prng.n - (char)N;
    }
    if (local_40 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(local_40);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}